

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

int qGetColumnType(QString *tpName)

{
  undefined1 *puVar1;
  qsizetype qVar2;
  char cVar3;
  byte bVar4;
  char *pcVar5;
  qsizetype qVar6;
  int iVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QLatin1String QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_38);
  qVar2 = local_38.d.size;
  puVar1 = (undefined1 *)(local_38.d.size + -3);
  switch(puVar1) {
  case (undefined1 *)0x0:
switchD_001122e3_caseD_0:
    QVar8.m_data = local_38.d.ptr;
    QVar8.m_size = qVar2;
    QVar16.m_data = "int";
    QVar16.m_size = 3;
    cVar3 = QtPrivate::equalStrings(QVar8,QVar16);
    iVar7 = 2;
    if (cVar3 != '\0') goto LAB_00112482;
    if ((undefined1 *)qVar2 == (undefined1 *)0x4) goto switchD_001122e3_caseD_1;
    if ((undefined1 *)qVar2 == (undefined1 *)0x5) goto switchD_001122e3_caseD_2;
    if ((undefined1 *)qVar2 == (undefined1 *)0x6) goto switchD_001122e3_caseD_3;
    break;
  case (undefined1 *)0x1:
switchD_001122e3_caseD_1:
    QVar12.m_data = local_38.d.ptr;
    QVar12.m_size = qVar2;
    QVar20.m_data = "real";
    QVar20.m_size = 4;
    cVar3 = QtPrivate::equalStrings(QVar12,QVar20);
    iVar7 = 6;
    if (cVar3 != '\0') goto LAB_00112482;
    break;
  case (undefined1 *)0x2:
switchD_001122e3_caseD_2:
    QVar11.m_data = local_38.d.ptr;
    QVar11.m_size = qVar2;
    QVar19.m_data = "float";
    QVar19.m_size = 5;
    cVar3 = QtPrivate::equalStrings(QVar11,QVar19);
    iVar7 = 6;
    if (cVar3 != '\0') goto LAB_00112482;
    if ((undefined1 *)qVar2 == (undefined1 *)0x4) goto switchD_001122e3_caseD_1;
    break;
  case (undefined1 *)0x3:
switchD_001122e3_caseD_3:
    QVar10.m_data = local_38.d.ptr;
    QVar10.m_size = qVar2;
    QVar18.m_data = "double";
    QVar18.m_size = 6;
    cVar3 = QtPrivate::equalStrings(QVar10,QVar18);
    iVar7 = 6;
    if (cVar3 != '\0') goto LAB_00112482;
    if ((undefined1 *)qVar2 == (undefined1 *)0x4) goto switchD_001122e3_caseD_1;
    if ((undefined1 *)qVar2 == (undefined1 *)0x5) goto switchD_001122e3_caseD_2;
    break;
  case (undefined1 *)0x4:
    QVar9.m_data = local_38.d.ptr;
    QVar9.m_size = local_38.d.size;
    QVar17.m_data = "integer";
    QVar17.m_size = 7;
    cVar3 = QtPrivate::equalStrings(QVar9,QVar17);
    iVar7 = 2;
    if (cVar3 != '\0') goto LAB_00112482;
    switch(puVar1) {
    case (undefined1 *)0x0:
      goto switchD_001122e3_caseD_0;
    case (undefined1 *)0x1:
      goto switchD_001122e3_caseD_1;
    case (undefined1 *)0x2:
      goto switchD_001122e3_caseD_2;
    case (undefined1 *)0x3:
      goto switchD_001122e3_caseD_3;
    }
  }
  QVar13.m_data = (char *)0x7;
  QVar13.m_size = (qsizetype)&local_38;
  cVar3 = QString::startsWith(QVar13,0x201659);
  qVar2 = local_38.d.size;
  iVar7 = 6;
  if (cVar3 == '\0') {
    if ((undefined1 *)local_38.d.size == (undefined1 *)0x4) {
      QVar14.m_data = local_38.d.ptr;
      QVar14.m_size = 4;
      QVar21.m_data = "blob";
      QVar21.m_size = 4;
      cVar3 = QtPrivate::equalStrings(QVar14,QVar21);
      iVar7 = 0xc;
      if (cVar3 != '\0') goto LAB_00112482;
    }
    if ((undefined1 *)qVar2 == (undefined1 *)0x7) {
      pcVar5 = "boolean";
      qVar6 = 7;
    }
    else {
      iVar7 = 10;
      if ((undefined1 *)qVar2 != (undefined1 *)0x4) goto LAB_00112482;
      pcVar5 = "bool";
      qVar6 = 4;
    }
    QVar15.m_data = local_38.d.ptr;
    QVar15.m_size = qVar2;
    QVar22.m_data = pcVar5;
    QVar22.m_size = qVar6;
    bVar4 = QtPrivate::equalStrings(QVar15,QVar22);
    iVar7 = (uint)(bVar4 ^ 1) + (uint)(bVar4 ^ 1) * 8 + 1;
  }
LAB_00112482:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int qGetColumnType(const QString &tpName)
{
    const QString typeName = tpName.toLower();

    if (typeName == "integer"_L1 || typeName == "int"_L1)
        return QMetaType::Int;
    if (typeName == "double"_L1
        || typeName == "float"_L1
        || typeName == "real"_L1
        || typeName.startsWith("numeric"_L1))
        return QMetaType::Double;
    if (typeName == "blob"_L1)
        return QMetaType::QByteArray;
    if (typeName == "boolean"_L1 || typeName == "bool"_L1)
        return QMetaType::Bool;
    return QMetaType::QString;
}